

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

void __thiscall NNTreeIterator::NNTreeIterator(NNTreeIterator *this,NNTreeImpl *impl)

{
  this->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ee0e0;
  this->impl = impl;
  (this->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->path;
  (this->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->path;
  (this->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  (this->node).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->node).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->item_number = -1;
  (this->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

NNTreeIterator::NNTreeIterator(NNTreeImpl& impl) :
    impl(impl),
    item_number(-1)
{
}